

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

void Gia_ManPrintChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)vChains->nSize;
  if (vChains->nSize < 1) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    do {
      pVVar3 = vChains->pArray;
      uVar1 = pVVar3[uVar6].nSize;
      if (uVar6 < 10) {
        printf("Chain %4d : %4d    ",uVar6 & 0xffffffff,(ulong)uVar1);
        if (0 < pVVar3[uVar6].nSize) {
          uVar7 = 0;
          do {
            uVar2 = pVVar3[uVar6].pArray[uVar7];
            if (((int)uVar2 < 0) || (uVar4 = uVar2 * 5 + 4, vFadds->nSize <= (int)uVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("%d(%d) ",(ulong)uVar2,(ulong)(uint)vFadds->pArray[uVar4]);
            if (uVar7 != pVVar3[uVar6].nSize - 1) {
              printf("-> ");
            }
            if (uVar7 == 7) {
              printf("...");
              break;
            }
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)pVVar3[uVar6].nSize);
        }
        putchar(10);
      }
      else if (uVar6 == 10) {
        puts("...");
      }
      uVar5 = uVar5 + uVar1;
      uVar6 = uVar6 + 1;
      uVar7 = (ulong)vChains->nSize;
    } while ((long)uVar6 < (long)uVar7);
  }
  printf("Total chains = %d. Total full-adders = %d.\n",uVar7,(ulong)uVar5);
  return;
}

Assistant:

void Gia_ManPrintChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd, Count = 0;
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        Count += Vec_IntSize(vChain);
        if ( i < 10 )
        {
            printf( "Chain %4d : %4d    ", i, Vec_IntSize(vChain) );
            Vec_IntForEachEntry( vChain, iFadd, k )
            {
                printf( "%d(%d) ", iFadd, Vec_IntEntry(vFadds, 5*iFadd+4) );
                if ( k != Vec_IntSize(vChain) - 1 )
                    printf( "-> " );
                if ( k > 6 )
                {
                    printf( "..." );
                    break;
                }
            }
            printf( "\n" );
        }
        else if ( i == 10 )
            printf( "...\n" );

    }
    printf( "Total chains = %d. Total full-adders = %d.\n", Vec_WecSize(vChains), Count );
}